

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cc
# Opt level: O0

bool google::protobuf::compiler::GenerateCode
               (CodeGeneratorRequest *request,CodeGenerator *generator,
               CodeGeneratorResponse *response,string *error_msg)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Status *this;
  AlphaNum *pAVar4;
  FeatureSetDefaults *from;
  LogMessage *pLVar5;
  FileDescriptorProto *proto;
  string *psVar6;
  reference ppFVar7;
  Version *compiler_version;
  undefined4 extraout_var;
  ulong uVar8;
  uint32_t *puVar9;
  Arena *arena;
  string_view sVar10;
  undefined1 local_348 [7];
  bool succeeded;
  string error;
  GeneratorResponseContext context;
  AlphaNum local_2b0;
  string local_280;
  string_view local_260;
  FileDescriptor *local_250;
  int local_244;
  undefined1 local_240 [4];
  int i_1;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  parsed_files;
  FileDescriptor *file;
  int i;
  LogMessage local_200;
  Voidify local_1e9;
  FeatureSetDefaults local_1e8;
  undefined1 local_1b0 [8];
  Status status;
  AlphaNum local_160;
  string local_130;
  undefined1 local_100 [8];
  StatusOr<google::protobuf::FeatureSetDefaults> defaults;
  DescriptorPool pool;
  string *error_msg_local;
  CodeGeneratorResponse *response_local;
  CodeGenerator *generator_local;
  CodeGeneratorRequest *request_local;
  
  DescriptorPool::DescriptorPool
            ((DescriptorPool *)
             ((long)&defaults.super_StatusOrData<google::protobuf::FeatureSetDefaults>.field_1 +
             0x30));
  CodeGenerator::BuildFeatureSetDefaults
            ((StatusOr<google::protobuf::FeatureSetDefaults> *)local_100,generator);
  bVar1 = absl::lts_20250127::StatusOr<google::protobuf::FeatureSetDefaults>::ok
                    ((StatusOr<google::protobuf::FeatureSetDefaults> *)local_100);
  if (bVar1) {
    from = absl::lts_20250127::StatusOr<google::protobuf::FeatureSetDefaults>::value
                     ((StatusOr<google::protobuf::FeatureSetDefaults> *)local_100);
    FeatureSetDefaults::FeatureSetDefaults(&local_1e8,from);
    DescriptorPool::SetFeatureSetDefaults
              ((DescriptorPool *)local_1b0,
               (FeatureSetDefaults *)
               ((long)&defaults.super_StatusOrData<google::protobuf::FeatureSetDefaults>.field_1 +
               0x30));
    FeatureSetDefaults::~FeatureSetDefaults(&local_1e8);
    bVar1 = absl::lts_20250127::Status::ok((Status *)local_1b0);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_200,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/plugin.cc"
                 ,0x6f,"status.ok()");
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_200);
      sVar10 = absl::lts_20250127::Status::message((Status *)local_1b0);
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,sVar10);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_1e9,pLVar5);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_200);
    }
    for (file._4_4_ = 0; iVar2 = CodeGeneratorRequest::proto_file_size(request), file._4_4_ < iVar2;
        file._4_4_ = file._4_4_ + 1) {
      proto = CodeGeneratorRequest::proto_file(request,file._4_4_);
      parsed_files.
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)DescriptorPool::BuildFile
                              ((DescriptorPool *)
                               ((long)&defaults.
                                       super_StatusOrData<google::protobuf::FeatureSetDefaults>.
                                       field_1 + 0x30),proto);
      if ((FileDescriptor *)
          parsed_files.
          super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage == (FileDescriptor *)0x0) {
        request_local._7_1_ = false;
        status.rep_._4_4_ = 1;
        goto LAB_0028ea9f;
      }
    }
    std::
    vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::vector((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              *)local_240);
    local_244 = 0;
    while( true ) {
      iVar2 = local_244;
      uVar3 = CodeGeneratorRequest::file_to_generate_size(request);
      pAVar4 = (AlphaNum *)(ulong)uVar3;
      if ((int)uVar3 <= iVar2) break;
      psVar6 = CodeGeneratorRequest::file_to_generate_abi_cxx11_(request,local_244);
      sVar10 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
      local_260 = sVar10;
      local_250 = DescriptorPool::FindFileByName
                            ((DescriptorPool *)
                             ((long)&defaults.
                                     super_StatusOrData<google::protobuf::FeatureSetDefaults>.
                                     field_1 + 0x30),sVar10);
      std::
      vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ::push_back((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   *)local_240,&local_250);
      ppFVar7 = std::
                vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::back((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                        *)local_240);
      if (*ppFVar7 == (value_type)0x0) {
        absl::lts_20250127::AlphaNum::AlphaNum
                  (&local_2b0,
                   "protoc asked plugin to generate a file but did not provide a descriptor for the file: "
                  );
        psVar6 = CodeGeneratorRequest::file_to_generate_abi_cxx11_(request,local_244);
        absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                  ((AlphaNum *)&context.parsed_files_,psVar6);
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_280,(lts_20250127 *)&local_2b0,(AlphaNum *)&context.parsed_files_,pAVar4);
        std::__cxx11::string::operator=((string *)error_msg,(string *)&local_280);
        std::__cxx11::string::~string((string *)&local_280);
        request_local._7_1_ = false;
        status.rep_._4_4_ = 1;
        goto LAB_0028ea83;
      }
      local_244 = local_244 + 1;
    }
    compiler_version = CodeGeneratorRequest::compiler_version(request);
    GeneratorResponseContext::GeneratorResponseContext
              ((GeneratorResponseContext *)((long)&error.field_2 + 8),compiler_version,response,
               (vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *)local_240);
    std::__cxx11::string::string((string *)local_348);
    psVar6 = CodeGeneratorRequest::parameter_abi_cxx11_(request);
    uVar3 = (*generator->_vptr_CodeGenerator[3])
                      (generator,local_240,psVar6,(undefined1 *)((long)&error.field_2 + 8),local_348
                      );
    iVar2 = (*generator->_vptr_CodeGenerator[4])();
    CodeGeneratorResponse::set_supported_features(response,CONCAT44(extraout_var,iVar2));
    iVar2 = (*generator->_vptr_CodeGenerator[7])();
    CodeGeneratorResponse::set_minimum_edition(response,iVar2);
    iVar2 = (*generator->_vptr_CodeGenerator[8])();
    CodeGeneratorResponse::set_maximum_edition(response,iVar2);
    if ((uVar3 & 1) == 0) {
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) != 0) {
        std::__cxx11::string::operator=
                  ((string *)local_348,
                   "Code generator returned false but provided no error description.");
      }
    }
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      puVar9 = internal::HasBits<1>::operator[](&(response->field_0)._impl_._has_bits_,0);
      *(byte *)puVar9 = (byte)*puVar9 | 1;
      arena = MessageLite::GetArena((MessageLite *)response);
      internal::ArenaStringPtr::Set<>(&(response->field_0)._impl_.error_,(string *)local_348,arena);
    }
    request_local._7_1_ = true;
    status.rep_._4_4_ = 1;
    std::__cxx11::string::~string((string *)local_348);
    GeneratorResponseContext::~GeneratorResponseContext
              ((GeneratorResponseContext *)((long)&error.field_2 + 8));
LAB_0028ea83:
    std::
    vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::~vector((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               *)local_240);
LAB_0028ea9f:
    absl::lts_20250127::Status::~Status((Status *)local_1b0);
  }
  else {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_160,"error generating feature defaults: ");
    this = absl::lts_20250127::StatusOr<google::protobuf::FeatureSetDefaults>::status
                     ((StatusOr<google::protobuf::FeatureSetDefaults> *)local_100);
    sVar10 = absl::lts_20250127::Status::message(this);
    pAVar4 = (AlphaNum *)sVar10._M_len;
    absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)&stack0xfffffffffffffe70,sVar10);
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_130,(lts_20250127 *)&local_160,(AlphaNum *)&stack0xfffffffffffffe70,pAVar4);
    std::__cxx11::string::operator=((string *)error_msg,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    request_local._7_1_ = false;
    status.rep_._4_4_ = 1;
  }
  absl::lts_20250127::StatusOr<google::protobuf::FeatureSetDefaults>::~StatusOr
            ((StatusOr<google::protobuf::FeatureSetDefaults> *)local_100);
  DescriptorPool::~DescriptorPool
            ((DescriptorPool *)
             ((long)&defaults.super_StatusOrData<google::protobuf::FeatureSetDefaults>.field_1 +
             0x30));
  return request_local._7_1_;
}

Assistant:

bool GenerateCode(const CodeGeneratorRequest& request,
                  const CodeGenerator& generator,
                  CodeGeneratorResponse* response, std::string* error_msg) {
  DescriptorPool pool;

  // Initialize feature set default mapping.
  absl::StatusOr<FeatureSetDefaults> defaults =
      generator.BuildFeatureSetDefaults();
  if (!defaults.ok()) {
    *error_msg = absl::StrCat("error generating feature defaults: ",
                              defaults.status().message());
    return false;
  }
  absl::Status status = pool.SetFeatureSetDefaults(std::move(defaults).value());
  ABSL_CHECK(status.ok()) << status.message();

  for (int i = 0; i < request.proto_file_size(); i++) {
    const FileDescriptor* file = pool.BuildFile(request.proto_file(i));
    if (file == nullptr) {
      // BuildFile() already wrote an error message.
      return false;
    }
  }

  std::vector<const FileDescriptor*> parsed_files;
  for (int i = 0; i < request.file_to_generate_size(); i++) {
    parsed_files.push_back(pool.FindFileByName(request.file_to_generate(i)));
    if (parsed_files.back() == nullptr) {
      *error_msg = absl::StrCat(
          "protoc asked plugin to generate a file but "
          "did not provide a descriptor for the file: ",
          request.file_to_generate(i));
      return false;
    }
  }

  GeneratorResponseContext context(request.compiler_version(), response,
                                   parsed_files);


  std::string error;
  bool succeeded = generator.GenerateAll(parsed_files, request.parameter(),
                                         &context, &error);

  response->set_supported_features(generator.GetSupportedFeatures());
  response->set_minimum_edition(
      static_cast<int>(generator.GetMinimumEdition()));
  response->set_maximum_edition(
      static_cast<int>(generator.GetMaximumEdition()));

  if (!succeeded && error.empty()) {
    error =
        "Code generator returned false but provided no error "
        "description.";
  }
  if (!error.empty()) {
    response->set_error(error);
  }

  return true;
}